

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * statusTipConfigKey(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)0x0;
  (in_RDI->d).d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  (in_RDI->d).ptr = L"statustip";
  local_28.size = 0;
  (in_RDI->d).size = 9;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QString statusTipConfigKey()     { return QStringLiteral("statustip"); }